

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

int __thiscall amrex::BoxList::simplify_doit(BoxList *this,int depth)

{
  bool bVar1;
  pointer pBVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  reference pBVar6;
  int in_ESI;
  int i;
  int joincnt;
  bool canjoin;
  int *bhi;
  int *blo;
  int cnt;
  iterator blb;
  int *ahi;
  int *alo;
  iterator End;
  iterator bla;
  int hi [3];
  int lo [3];
  int count;
  BoxList *in_stack_ffffffffffffff38;
  pointer in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  uint local_90;
  IntVect local_8c;
  BoxList *in_stack_ffffffffffffff80;
  int local_74;
  int local_70;
  int local_54;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_50;
  int *local_48;
  int *local_40;
  Box *local_38;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_> local_30;
  int local_28 [6];
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  local_30._M_current = (Box *)begin(in_stack_ffffffffffffff38);
  local_38 = (Box *)end(in_stack_ffffffffffffff38);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      removeEmpty(in_stack_ffffffffffffff80);
      return local_10;
    }
    pBVar2 = __gnu_cxx::
             __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator->(&local_30);
    local_40 = Box::loVect(pBVar2);
    pBVar2 = __gnu_cxx::
             __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator->(&local_30);
    local_48 = Box::hiVect(pBVar2);
    local_50 = __gnu_cxx::
               __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator+((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                           (difference_type)in_stack_ffffffffffffff40);
    local_54 = 0;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          *)in_stack_ffffffffffffff40,
                         (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                          *)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff4f = bVar1 && local_54 < local_c;
      if (!bVar1 || local_54 >= local_c) break;
      pBVar2 = __gnu_cxx::
               __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator->(&local_50);
      piVar3 = Box::loVect(pBVar2);
      pBVar2 = __gnu_cxx::
               __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
               ::operator->(&local_50);
      piVar4 = Box::hiVect(pBVar2);
      bVar1 = true;
      local_70 = 0;
      for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
        if ((local_40[local_74] == piVar3[local_74]) && (local_48[local_74] == piVar4[local_74])) {
          local_28[(long)local_74 + 3] = local_40[local_74];
          local_28[local_74] = local_48[local_74];
        }
        else {
          if ((piVar3[local_74] < local_40[local_74]) || (local_48[local_74] + 1 < piVar3[local_74])
             ) {
            if ((local_40[local_74] < piVar3[local_74]) ||
               (piVar4[local_74] + 1 < local_40[local_74])) {
              bVar1 = false;
              break;
            }
            local_28[(long)local_74 + 3] = piVar3[local_74];
            piVar5 = std::max<int>(local_48 + local_74,piVar4 + local_74);
            local_28[local_74] = *piVar5;
          }
          else {
            local_28[(long)local_74 + 3] = local_40[local_74];
            piVar5 = std::max<int>(local_48 + local_74,piVar4 + local_74);
            local_28[local_74] = *piVar5;
          }
          local_70 = local_70 + 1;
        }
      }
      if ((bVar1) && (local_70 < 2)) {
        in_stack_ffffffffffffff38 =
             (BoxList *)
             __gnu_cxx::
             __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator->(&local_50);
        IntVect::IntVect((IntVect *)&stack0xffffffffffffff80,local_28 + 3);
        Box::setSmall((Box *)in_stack_ffffffffffffff38,(IntVect *)&stack0xffffffffffffff80);
        in_stack_ffffffffffffff40 =
             __gnu_cxx::
             __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
             ::operator->(&local_50);
        IntVect::IntVect(&local_8c,local_28);
        Box::setBig(in_stack_ffffffffffffff40,&local_8c);
        Box::Box(in_stack_ffffffffffffff40);
        pBVar6 = __gnu_cxx::
                 __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                 ::operator*(&local_30);
        *(undefined8 *)(pBVar6->smallend).vect = local_a8;
        *(undefined8 *)((pBVar6->smallend).vect + 2) = local_a0;
        *(undefined8 *)((pBVar6->bigend).vect + 1) = local_98;
        (pBVar6->btype).itype = local_90;
        local_10 = local_10 + 1;
        break;
      }
      local_54 = local_54 + 1;
      __gnu_cxx::
      __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
      operator++(&local_50);
    }
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(&local_30);
  } while( true );
}

Assistant:

int
BoxList::simplify_doit (int depth)
{
    //
    // Try to merge adjacent boxes.
    //
    int count = 0, lo[AMREX_SPACEDIM], hi[AMREX_SPACEDIM];

    for (iterator bla = begin(), End = end(); bla != End; ++bla)
    {
        const int* alo   = bla->loVect();
        const int* ahi   = bla->hiVect();

        iterator blb = bla + 1;
        for (int cnt = 0; blb != End && cnt < depth; ++cnt, ++blb)
        {
            const int* blo = blb->loVect();
            const int* bhi = blb->hiVect();
            //
            // Determine if a and b can be coalesced.
            // They must have equal extents in all index directions
            // except possibly one, and must abutt in that direction.
            //
            bool canjoin = true;
            int  joincnt = 0;
            for (int i = 0; i < AMREX_SPACEDIM; i++)
            {
                if (alo[i]==blo[i] && ahi[i]==bhi[i])
                {
                    lo[i] = alo[i];
                    hi[i] = ahi[i];
                }
                else if (alo[i]<=blo[i] && blo[i]<=ahi[i]+1)
                {
                    lo[i] = alo[i];
                    hi[i] = std::max(ahi[i],bhi[i]);
                    joincnt++;
                }
                else if (blo[i]<=alo[i] && alo[i]<=bhi[i]+1)
                {
                    lo[i] = blo[i];
                    hi[i] = std::max(ahi[i],bhi[i]);
                    joincnt++;
                }
                else
                {
                    canjoin = false;
                    break;
                }
            }
            if (canjoin && (joincnt <= 1))
            {
                //
                // Modify b and set a to empty
                //
                blb->setSmall(IntVect(lo));
                blb->setBig(IntVect(hi));
                *bla = Box();
                ++count;
                break;
            }
        }
    }

    removeEmpty();

    return count;
}